

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O0

void __thiscall
r_code::list<core::P<r_exec::Overlay>_>::push_front_new_cell
          (list<core::P<r_exec::Overlay>_> *this,P<r_exec::Overlay> *t)

{
  size_type sVar1;
  undefined1 local_30 [8];
  cell c;
  P<r_exec::Overlay> *t_local;
  list<core::P<r_exec::Overlay>_> *this_local;
  
  c.data.object = (_Object *)t;
  cell::cell((cell *)local_30);
  core::P<r_exec::Overlay>::operator=
            ((P<r_exec::Overlay> *)&c.prev,(P<r_exec::Overlay> *)c.data.object);
  local_30 = (undefined1  [8])this->used_cells_head;
  c.next = -1;
  std::
  vector<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
  ::push_back(&this->cells,(value_type *)local_30);
  sVar1 = std::
          vector<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
          ::size(&this->cells);
  this->used_cells_head = sVar1 - 1;
  cell::~cell((cell *)local_30);
  return;
}

Assistant:

void push_front_new_cell(const T &t)
    {
        cell c;
        c.data = t;
        c.next = used_cells_head;
        c.prev = null;
        cells.push_back(c);
        used_cells_head = cells.size() - 1;
    }